

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclConsoleConstProperty<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyId propertyId_00;
  FrameDisplay *this_00;
  DynamicObject *obj;
  undefined4 *puVar4;
  void *obj_00;
  JavascriptLibrary *this_01;
  Var newValue;
  PropertyId propertyId;
  FrameDisplay *pScope;
  OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = (FrameDisplay *)LdEnv(this);
  uVar3 = FrameDisplay::GetLength(this_00);
  obj = (DynamicObject *)FrameDisplay::GetItem(this_00,uVar3 - 1);
  bVar2 = VarIs<Js::ConsoleScopeActivationObject,Js::DynamicObject>(obj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1409,
                                "(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)))"
                                ,"How come we got this opcode without ConsoleScopeActivationObject?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyId_00 =
       FunctionBody::GetReferencedPropertyId
                 (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  obj_00 = FrameDisplay::GetItem(this_00,0);
  this_01 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  newValue = JavascriptLibrary::GetUndeclBlockVar(this_01);
  Js::JavascriptOperators::OP_InitConstProperty(obj_00,propertyId_00,newValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclConsoleConstProperty(unaligned T* playout)
    {
        FrameDisplay* pScope = (FrameDisplay*)this->LdEnv();
        AssertMsg(VarIs<ConsoleScopeActivationObject>((DynamicObject*)pScope->GetItem(pScope->GetLength() - 1)), "How come we got this opcode without ConsoleScopeActivationObject?");
        PropertyId propertyId = m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex);
        JavascriptOperators::OP_InitConstProperty(pScope->GetItem(0), propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }